

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFNameTreeObjectHelper::iterator::iterator(iterator *this,shared_ptr<NNTreeIterator> *i)

{
  this->_vptr_iterator = (_func_int **)&PTR__iterator_002ad580;
  std::__shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>,
             &i->super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>);
  (this->ivalue).first._M_dataplus._M_p = (pointer)&(this->ivalue).first.field_2;
  (this->ivalue).first._M_string_length = 0;
  (this->ivalue).first.field_2._M_local_buf[0] = '\0';
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

QPDFNameTreeObjectHelper::iterator::iterator(std::shared_ptr<NNTreeIterator> const& i) :
    impl(i)
{
}